

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O3

void jinit_merged_upsampler(j_decompress_ptr cinfo)

{
  long lVar1;
  int iVar2;
  jpeg_upsampler *pjVar3;
  code *pcVar4;
  void *pvVar5;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var6;
  _func_void_j_decompress_ptr *p_Var7;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var8;
  long lVar9;
  long lVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  long lVar13;
  
  pjVar3 = (jpeg_upsampler *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x58);
  cinfo->upsample = pjVar3;
  pjVar3->start_pass = start_pass_merged_upsample;
  pjVar3->need_context_rows = 0;
  *(JDIMENSION *)((long)&pjVar3[3].start_pass + 4) =
       cinfo->out_color_components * cinfo->output_width;
  if (cinfo->max_v_samp_factor == 2) {
    pjVar3->upsample = merged_2v_upsample;
    iVar2 = jsimd_can_h2v2_merged_upsample();
    if (iVar2 == 0) {
      pcVar4 = h2v2_merged_upsample;
    }
    else {
      pcVar4 = jsimd_h2v2_merged_upsample;
    }
    pjVar3[1].start_pass = pcVar4;
    if (cinfo->out_color_space == JCS_RGB565) {
      pcVar4 = h2v2_merged_upsample_565D;
      if (cinfo->dither_mode == JDITHER_NONE) {
        pcVar4 = h2v2_merged_upsample_565;
      }
      pjVar3[1].start_pass = pcVar4;
    }
    pvVar5 = (*cinfo->mem->alloc_large)
                       ((j_common_ptr)cinfo,1,
                        (size_t)*(undefined4 *)((long)&pjVar3[3].start_pass + 4));
  }
  else {
    pjVar3->upsample = merged_1v_upsample;
    iVar2 = jsimd_can_h2v1_merged_upsample();
    if (iVar2 == 0) {
      pcVar4 = h2v1_merged_upsample;
    }
    else {
      pcVar4 = jsimd_h2v1_merged_upsample;
    }
    pjVar3[1].start_pass = pcVar4;
    if (cinfo->out_color_space == JCS_RGB565) {
      pcVar4 = h2v1_merged_upsample_565D;
      if (cinfo->dither_mode == JDITHER_NONE) {
        pcVar4 = h2v1_merged_upsample_565;
      }
      pjVar3[1].start_pass = pcVar4;
    }
    pvVar5 = (void *)0x0;
  }
  *(void **)&pjVar3[2].need_context_rows = pvVar5;
  pjVar3 = cinfo->upsample;
  p_Var6 = (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
            *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x400);
  pjVar3[1].upsample = p_Var6;
  pvVar5 = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x400);
  *(void **)&pjVar3[1].need_context_rows = pvVar5;
  p_Var7 = (_func_void_j_decompress_ptr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x800);
  pjVar3[2].start_pass = p_Var7;
  p_Var8 = (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
            *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x800);
  pjVar3[2].upsample = p_Var8;
  p_Var6 = pjVar3[1].upsample;
  lVar1 = *(long *)&pjVar3[1].need_context_rows;
  p_Var7 = pjVar3[2].start_pass;
  lVar9 = 0x2c8d00;
  lVar10 = 0x5b6900;
  puVar11 = (undefined1 *)0xffffffffff1daf00;
  puVar12 = (undefined1 *)0xffffffffff4d0b80;
  lVar13 = 0;
  do {
    *(int *)(p_Var6 + lVar13) = (int)((ulong)puVar12 >> 0x10);
    *(int *)(lVar1 + lVar13) = (int)((ulong)puVar11 >> 0x10);
    *(long *)(p_Var7 + lVar13 * 2) = lVar10;
    *(long *)(p_Var8 + lVar13 * 2) = lVar9;
    lVar13 = lVar13 + 4;
    lVar9 = lVar9 + -0x581a;
    lVar10 = lVar10 + -0xb6d2;
    puVar11 = &F_1_772 + (long)puVar11;
    puVar12 = &F_1_402 + (long)puVar12;
  } while (lVar13 != 0x400);
  return;
}

Assistant:

GLOBAL(void)
jinit_merged_upsampler(j_decompress_ptr cinfo)
{
  my_merged_upsample_ptr upsample;

  upsample = (my_merged_upsample_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_merged_upsampler));
  cinfo->upsample = (struct jpeg_upsampler *)upsample;
  upsample->pub.start_pass = start_pass_merged_upsample;
  upsample->pub.need_context_rows = FALSE;

  upsample->out_row_width = cinfo->output_width * cinfo->out_color_components;

  if (cinfo->max_v_samp_factor == 2) {
    upsample->pub.upsample = merged_2v_upsample;
    if (jsimd_can_h2v2_merged_upsample())
      upsample->upmethod = jsimd_h2v2_merged_upsample;
    else
      upsample->upmethod = h2v2_merged_upsample;
    if (cinfo->out_color_space == JCS_RGB565) {
      if (cinfo->dither_mode != JDITHER_NONE) {
        upsample->upmethod = h2v2_merged_upsample_565D;
      } else {
        upsample->upmethod = h2v2_merged_upsample_565;
      }
    }
    /* Allocate a spare row buffer */
    upsample->spare_row = (JSAMPROW)
      (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                (size_t)(upsample->out_row_width * sizeof(JSAMPLE)));
  } else {
    upsample->pub.upsample = merged_1v_upsample;
    if (jsimd_can_h2v1_merged_upsample())
      upsample->upmethod = jsimd_h2v1_merged_upsample;
    else
      upsample->upmethod = h2v1_merged_upsample;
    if (cinfo->out_color_space == JCS_RGB565) {
      if (cinfo->dither_mode != JDITHER_NONE) {
        upsample->upmethod = h2v1_merged_upsample_565D;
      } else {
        upsample->upmethod = h2v1_merged_upsample_565;
      }
    }
    /* No spare row needed */
    upsample->spare_row = NULL;
  }

  build_ycc_rgb_table(cinfo);
}